

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_parse_key_pkcs8_unencrypted_der(mbedtls_pk_context *pk,uchar *key,size_t keylen)

{
  mbedtls_pk_info_t *info;
  mbedtls_rsa_context *rsa;
  mbedtls_ecp_keypair *pmVar1;
  mbedtls_pk_info_t *pk_info;
  uchar *puStack_60;
  mbedtls_pk_type_t pk_alg;
  uchar *end;
  uchar *p;
  mbedtls_asn1_buf params;
  size_t len;
  int version;
  int ret;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_pk_context *pk_local;
  
  puStack_60 = key + keylen;
  pk_info._4_4_ = MBEDTLS_PK_NONE;
  end = key;
  _version = keylen;
  keylen_local = (size_t)key;
  key_local = (uchar *)pk;
  len._4_4_ = mbedtls_asn1_get_tag(&end,puStack_60,(size_t *)&params.p,0x30);
  if (len._4_4_ != 0) {
    return len._4_4_ + -0x3d00;
  }
  puStack_60 = end + (long)params.p;
  len._4_4_ = mbedtls_asn1_get_int(&end,puStack_60,(int *)&len);
  if (len._4_4_ != 0) {
    return len._4_4_ + -0x3d00;
  }
  if ((int)len != 0) {
    return -0x3d80;
  }
  len._4_4_ = pk_get_pk_alg(&end,puStack_60,(mbedtls_pk_type_t *)((long)&pk_info + 4),
                            (mbedtls_asn1_buf *)&p);
  if (len._4_4_ != 0) {
    return len._4_4_ + -0x3d00;
  }
  len._4_4_ = mbedtls_asn1_get_tag(&end,puStack_60,(size_t *)&params.p,4);
  if (len._4_4_ != 0) {
    return len._4_4_ + -0x3d00;
  }
  if (params.p == (uchar *)0x0) {
    return -0x3d60;
  }
  info = mbedtls_pk_info_from_type(pk_info._4_4_);
  if (info == (mbedtls_pk_info_t *)0x0) {
    return -0x3c80;
  }
  len._4_4_ = mbedtls_pk_setup((mbedtls_pk_context *)key_local,info);
  if (len._4_4_ != 0) {
    return len._4_4_;
  }
  if (pk_info._4_4_ == MBEDTLS_PK_RSA) {
    rsa = mbedtls_pk_rsa(*(mbedtls_pk_context *)key_local);
    len._4_4_ = pk_parse_key_pkcs1_der(rsa,end,(size_t)params.p);
    if (len._4_4_ != 0) {
      mbedtls_pk_free((mbedtls_pk_context *)key_local);
      return len._4_4_;
    }
LAB_001140ab:
    pk_local._4_4_ = 0;
  }
  else {
    if ((pk_info._4_4_ != MBEDTLS_PK_ECKEY) && (pk_info._4_4_ != MBEDTLS_PK_ECKEY_DH)) {
      return -0x3c80;
    }
    pmVar1 = mbedtls_pk_ec(*(mbedtls_pk_context *)key_local);
    len._4_4_ = pk_use_ecparams((mbedtls_asn1_buf *)&p,&pmVar1->grp);
    if (len._4_4_ == 0) {
      pmVar1 = mbedtls_pk_ec(*(mbedtls_pk_context *)key_local);
      len._4_4_ = pk_parse_key_sec1_der(pmVar1,end,(size_t)params.p);
      if (len._4_4_ == 0) goto LAB_001140ab;
    }
    mbedtls_pk_free((mbedtls_pk_context *)key_local);
    pk_local._4_4_ = len._4_4_;
  }
  return pk_local._4_4_;
}

Assistant:

static int pk_parse_key_pkcs8_unencrypted_der(
                                    mbedtls_pk_context *pk,
                                    const unsigned char* key,
                                    size_t keylen )
{
    int ret, version;
    size_t len;
    mbedtls_asn1_buf params;
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = p + keylen;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    const mbedtls_pk_info_t *pk_info;

    /*
     * This function parses the PrivateKeyInfo object (PKCS#8 v1.2 = RFC 5208)
     *
     *    PrivateKeyInfo ::= SEQUENCE {
     *      version                   Version,
     *      privateKeyAlgorithm       PrivateKeyAlgorithmIdentifier,
     *      privateKey                PrivateKey,
     *      attributes           [0]  IMPLICIT Attributes OPTIONAL }
     *
     *    Version ::= INTEGER
     *    PrivateKeyAlgorithmIdentifier ::= AlgorithmIdentifier
     *    PrivateKey ::= OCTET STRING
     *
     *  The PrivateKey OCTET STRING is a SEC1 ECPrivateKey
     */

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &version ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( version != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION + ret );

    if( ( ret = pk_get_pk_alg( &p, end, &pk_alg, &params ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( len < 1 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( ( pk_info = mbedtls_pk_info_from_type( pk_alg ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( pk, pk_info ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA )
    {
        if( ( ret = pk_parse_key_pkcs1_der( mbedtls_pk_rsa( *pk ), p, len ) ) != 0 )
        {
            mbedtls_pk_free( pk );
            return( ret );
        }
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( pk_alg == MBEDTLS_PK_ECKEY || pk_alg == MBEDTLS_PK_ECKEY_DH )
    {
        if( ( ret = pk_use_ecparams( &params, &mbedtls_pk_ec( *pk )->grp ) ) != 0 ||
            ( ret = pk_parse_key_sec1_der( mbedtls_pk_ec( *pk ), p, len )  ) != 0 )
        {
            mbedtls_pk_free( pk );
            return( ret );
        }
    } else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    return( 0 );
}